

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O0

TimingControl *
slang::ast::CycleDelayControl::fromSyntax
          (Compilation *compilation,DelaySyntax *syntax,ASTContext *context)

{
  bool bVar1;
  bool bVar2;
  ASTContext *this;
  DiagCode extraout_var;
  CycleDelayControl *pCVar3;
  bitmask<slang::ast::ASTFlags> *r;
  Symbol *pSVar4;
  SourceLocation in_RDX;
  SourceLocation in_RDI;
  SourceRange SVar5;
  CycleDelayControl *result;
  Expression *expr;
  TimingControl *in_stack_ffffffffffffff58;
  Compilation *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  SourceLocation expr_00;
  DiagCode code;
  Scope *in_stack_ffffffffffffff98;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffb0;
  SourceLocation this_00;
  bitmask<slang::ast::ASTFlags> local_30;
  int local_28;
  SourceLocation local_20;
  SourceLocation local_10;
  CycleDelayControl *local_8;
  
  local_20 = in_RDX;
  local_10 = in_RDI;
  this = (ASTContext *)
         not_null<slang::syntax::ExpressionSyntax_*>::operator*
                   ((not_null<slang::syntax::ExpressionSyntax_*> *)0x4bf550);
  expr_00 = local_20;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_30,None);
  local_28 = Expression::bind((int)this,(sockaddr *)expr_00,(socklen_t)local_30.m_bits);
  code = extraout_var;
  SVar5 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffffb0.m_bits);
  this_00 = SVar5.startLoc;
  pCVar3 = BumpAllocator::
           emplace<slang::ast::CycleDelayControl,slang::ast::Expression_const&,slang::SourceRange>
                     ((BumpAllocator *)expr_00,(Expression *)this,
                      (SourceRange *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  bVar1 = ASTContext::requireIntegral((ASTContext *)local_10,(Expression *)expr_00);
  if (bVar1) {
    r = (bitmask<slang::ast::ASTFlags> *)((long)local_20 + 0x10);
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffffb0,LValue);
    bVar2 = bitmask<slang::ast::ASTFlags>::has
                      ((bitmask<slang::ast::ASTFlags> *)
                       CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),r);
    bVar1 = false;
    if (!bVar2) {
      not_null<const_slang::ast::Scope_*>::operator->
                ((not_null<const_slang::ast::Scope_*> *)0x4bf657);
      bVar2 = Scope::isUninstantiated(in_stack_ffffffffffffff98);
      bVar1 = false;
      if (!bVar2) {
        not_null<const_slang::ast::Scope_*>::operator*
                  ((not_null<const_slang::ast::Scope_*> *)0x4bf686);
        pSVar4 = Compilation::getDefaultClocking
                           ((Compilation *)this_00,(Scope *)in_stack_ffffffffffffffb0.m_bits);
        bVar1 = pSVar4 == (Symbol *)0x0;
      }
    }
    local_8 = pCVar3;
    if (bVar1) {
      slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffffb0.m_bits);
      SVar5.endLoc = local_10;
      SVar5.startLoc = expr_00;
      ASTContext::addDiag(this,code,SVar5);
    }
  }
  else {
    local_8 = (CycleDelayControl *)
              TimingControl::badCtrl(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  return &local_8->super_TimingControl;
}

Assistant:

TimingControl& CycleDelayControl::fromSyntax(Compilation& compilation, const DelaySyntax& syntax,
                                             const ASTContext& context) {
    auto& expr = Expression::bind(*syntax.delayValue, context);
    auto result = compilation.emplace<CycleDelayControl>(expr, syntax.sourceRange());

    if (!context.requireIntegral(expr))
        return badCtrl(compilation, result);

    if (!context.flags.has(ASTFlags::LValue) && !context.scope->isUninstantiated() &&
        !compilation.getDefaultClocking(*context.scope)) {
        context.addDiag(diag::NoDefaultClocking, syntax.sourceRange());
    }

    return *result;
}